

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcSC3DMCEncoder.h
# Opt level: O2

void __thiscall
o3dgc::SC3DMCEncoder<unsigned_short>::SC3DMCEncoder(SC3DMCEncoder<unsigned_short> *this)

{
  TriangleListEncoder<unsigned_short>::TriangleListEncoder(&this->m_triangleListEncoder);
  this->m_quantFloatArraySize = 0;
  this->m_bufferAC = (uchar *)0x0;
  this->m_sizeBufferAC = 0;
  this->m_quantFloatArray = (long *)0x0;
  this->m_posSize = 0;
  memset(&this->m_predictors,0,0x2064);
  return;
}

Assistant:

SC3DMCEncoder(void)
                                    {
                                        m_posSize             = 0;
                                        m_quantFloatArray     = 0;
                                        m_quantFloatArraySize = 0;
                                        m_sizeBufferAC        = 0;
                                        m_bufferAC            = 0;
                                        m_normals             = 0;
                                        m_normalsSize         = 0;
                                        m_streamType          = O3DGC_STREAM_TYPE_UNKOWN;
                                    }